

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall CaDiCaL::Solver::configure(Solver *this,char *name)

{
  FILE *pFVar1;
  uint *puVar2;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 extraout_AL_02;
  undefined1 extraout_AL_03;
  undefined1 extraout_AL_04;
  undefined1 extraout_AL_05;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  uint uVar4;
  undefined8 in_RCX;
  Solver *pSVar5;
  uint lit;
  uint lit_00;
  uint lit_01;
  uint lit_02;
  long extraout_RDX;
  int elit;
  Solver *this_00;
  char *pcVar6;
  char *pcVar7;
  Solver *pSVar8;
  uint in_R8D;
  uint in_R9D;
  ulong unaff_R12;
  long lVar9;
  uint *puVar10;
  ulong unaff_R15;
  bool bVar11;
  
  bVar11 = this->internal == (Internal *)0x0;
  pFVar1 = (FILE *)this->trace_api_file;
  pcVar7 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar1 == (FILE *)0x0 || bVar11);
  if (pFVar1 != (FILE *)0x0 && !bVar11) {
    pcVar7 = name;
    fprintf(pFVar1,"%s %s\n","configure");
    fflush((FILE *)this->trace_api_file);
  }
  pcVar6 = "bool CaDiCaL::Solver::configure(const char *)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"bool CaDiCaL::Solver::configure(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar7);
  if (this->external == (External *)0x0) {
    configure();
LAB_0083c7ab:
    configure();
LAB_0083c7b0:
    configure();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0083c7ab;
    if ((this->_state & VALID) == 0) goto LAB_0083c7b0;
    if (this->_state == CONFIGURING) {
      bVar11 = Config::set(&this->internal->opts,name);
      return bVar11;
    }
  }
  configure((Solver *)name);
  this_00 = (Solver *)((ulong)pcVar6 & 0xffffffff);
  bVar11 = ((Solver *)name)->internal == (Internal *)0x0;
  pFVar1 = (FILE *)((Solver *)name)->trace_api_file;
  pSVar5 = (Solver *)CONCAT71((int7)((ulong)pcVar7 >> 8),pFVar1 == (FILE *)0x0 || bVar11);
  if (pFVar1 != (FILE *)0x0 && !bVar11) {
    pSVar5 = this_00;
    fprintf(pFVar1,"%s %d\n","add");
    fflush((FILE *)((Solver *)name)->trace_api_file);
  }
  pcVar7 = "void CaDiCaL::Solver::add(int)";
  pSVar8 = (Solver *)name;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)name,"void CaDiCaL::Solver::add(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar5->adding_clause);
  if (((Solver *)name)->external == (External *)0x0) {
    add();
LAB_0083c873:
    add();
  }
  else {
    if (((Solver *)name)->internal == (Internal *)0x0) goto LAB_0083c873;
    if ((((Solver *)name)->_state & VALID) != 0) {
      transition_to_steady_state((Solver *)name);
      elit = (int)pcVar6;
      External::add(((Solver *)name)->external,elit);
      ((Solver *)name)->adding_clause = elit != 0;
      if (elit == 0) {
        uVar3 = extraout_RAX;
        if ((((Solver *)name)->adding_constraint != false) ||
           (uVar3 = 4, ((Solver *)name)->_state == STEADY)) goto LAB_0083c867;
      }
      else {
        uVar3 = 8;
        if (((Solver *)name)->_state == ADDING) goto LAB_0083c867;
      }
      ((Solver *)name)->_state = (State)uVar3;
LAB_0083c867:
      return SUB81(uVar3,0);
    }
  }
  add();
  add();
  if (((ulong)pcVar7 & 0x7fffffff) != 0) {
    add(pSVar8,(int)pcVar7);
    add(pSVar8,0);
    return (bool)extraout_AL;
  }
  pSVar8 = (Solver *)((ulong)pcVar7 & 0xffffffff);
  clause(pSVar8);
  if (((ulong)pcVar7 & 0x7fffffff) == 0) {
    clause((Solver *)((ulong)pcVar7 & 0xffffffff));
  }
  else {
    name = (char *)(ulong)lit;
    if ((lit & 0x7fffffff) != 0) {
      add(pSVar8,(int)pcVar7);
      add(pSVar8,lit);
      add(pSVar8,0);
      return (bool)extraout_AL_00;
    }
  }
  pSVar8 = (Solver *)((ulong)name & 0xffffffff);
  clause(pSVar8);
  if (((ulong)pcVar7 & 0x7fffffff) == 0) {
    clause((Solver *)((ulong)pcVar7 & 0xffffffff));
LAB_0083c93f:
    clause(this_00);
  }
  else {
    this_00 = (Solver *)(ulong)lit_00;
    if ((lit_00 & 0x7fffffff) == 0) goto LAB_0083c93f;
    name = (char *)((ulong)pSVar5 & 0xffffffff);
    if (((ulong)pSVar5 & 0x7fffffff) != 0) {
      add(pSVar8,(int)pcVar7);
      add(pSVar8,lit_00);
      add(pSVar8,(int)pSVar5);
      add(pSVar8,0);
      return (bool)extraout_AL_01;
    }
  }
  pSVar8 = (Solver *)((ulong)name & 0xffffffff);
  clause(pSVar8);
  uVar4 = (uint)pSVar5;
  if (((ulong)pcVar7 & 0x7fffffff) == 0) {
    clause((Solver *)((ulong)pcVar7 & 0xffffffff));
LAB_0083c9c0:
    clause((Solver *)(unaff_R15 & 0xffffffff));
LAB_0083c9c8:
    clause(this_00);
  }
  else {
    unaff_R15 = (ulong)lit_01;
    if ((lit_01 & 0x7fffffff) == 0) goto LAB_0083c9c0;
    this_00 = (Solver *)((ulong)pSVar5 & 0xffffffff);
    if (((ulong)pSVar5 & 0x7fffffff) == 0) goto LAB_0083c9c8;
    name = (char *)(ulong)in_R8D;
    if ((in_R8D & 0x7fffffff) != 0) {
      add(pSVar8,(int)pcVar7);
      add(pSVar8,lit_01);
      add(pSVar8,uVar4);
      add(pSVar8,in_R8D);
      add(pSVar8,0);
      return (bool)extraout_AL_02;
    }
  }
  pSVar5 = (Solver *)((ulong)name & 0xffffffff);
  clause(pSVar5);
  if (((ulong)pcVar7 & 0x7fffffff) == 0) {
    clause((Solver *)((ulong)pcVar7 & 0xffffffff));
LAB_0083ca5f:
    clause((Solver *)(unaff_R12 & 0xffffffff));
LAB_0083ca67:
    clause((Solver *)(unaff_R15 & 0xffffffff));
  }
  else {
    unaff_R12 = (ulong)lit_02;
    if ((lit_02 & 0x7fffffff) == 0) goto LAB_0083ca5f;
    unaff_R15 = (ulong)uVar4;
    if ((uVar4 & 0x7fffffff) == 0) goto LAB_0083ca67;
    this_00 = (Solver *)(ulong)in_R8D;
    if ((in_R8D & 0x7fffffff) != 0) {
      name = (char *)(ulong)in_R9D;
      if ((in_R9D & 0x7fffffff) != 0) {
        add(pSVar5,(int)pcVar7);
        add(pSVar5,lit_02);
        add(pSVar5,uVar4);
        add(pSVar5,in_R8D);
        add(pSVar5,in_R9D);
        add(pSVar5,0);
        return (bool)extraout_AL_03;
      }
      goto LAB_0083ca76;
    }
  }
  clause(this_00);
LAB_0083ca76:
  pSVar5 = (Solver *)((ulong)name & 0xffffffff);
  clause(pSVar5);
  pcVar6 = pcVar7;
  if (pcVar7 == (char *)0x0 && extraout_RDX != 0) {
LAB_0083cae4:
    clause();
    puVar10 = *(uint **)pcVar6;
    puVar2 = *(uint **)(pcVar6 + 8);
    while( true ) {
      if (puVar10 == puVar2) {
        add(pSVar5,0);
        return (bool)extraout_AL_05;
      }
      uVar4 = *puVar10;
      if ((uVar4 & 0x7fffffff) == 0) break;
      add(pSVar5,uVar4);
      puVar10 = puVar10 + 1;
    }
    pSVar5 = (Solver *)(ulong)uVar4;
    clause(pSVar5);
    return pSVar5->internal->unsat;
  }
  if (extraout_RDX != 0) {
    lVar9 = 0;
    do {
      uVar4 = *(uint *)(pcVar7 + lVar9);
      pcVar6 = (char *)(ulong)uVar4;
      if ((uVar4 & 0x7fffffff) == 0) {
        pSVar5 = (Solver *)(ulong)uVar4;
        clause(pSVar5);
        goto LAB_0083cae4;
      }
      add(pSVar5,uVar4);
      lVar9 = lVar9 + 4;
    } while (extraout_RDX << 2 != lVar9);
  }
  add(pSVar5,0);
  return (bool)extraout_AL_04;
}

Assistant:

bool Solver::configure (const char *name) {
  TRACE ("configure", name);
  LOG_API_CALL_BEGIN ("configure", name);
  REQUIRE_VALID_STATE ();
  REQUIRE (state () == CONFIGURING,
           "can only set configuration '%s' right after initialization",
           name);
  bool res = Config::set (internal->opts, name);
  LOG_API_CALL_END ("configure", name, res);
  return res;
}